

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

TextureFormat vk::getStencilCopyFormat(VkFormat combinedFormat)

{
  TextureFormat TStack_10;
  VkFormat combinedFormat_local;
  
  if ((combinedFormat - VK_FORMAT_D16_UNORM < 3) || (3 < combinedFormat - VK_FORMAT_S8_UINT)) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0);
  }
  else {
    TStack_10 = mapVkFormat(VK_FORMAT_S8_UINT);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat getStencilCopyFormat (VkFormat combinedFormat)
{
	switch (combinedFormat)
	{
		case VK_FORMAT_D16_UNORM_S8_UINT:
		case VK_FORMAT_D24_UNORM_S8_UINT:
		case VK_FORMAT_D32_SFLOAT_S8_UINT:
		case VK_FORMAT_S8_UINT:
			return mapVkFormat(VK_FORMAT_S8_UINT);

		case VK_FORMAT_D16_UNORM:
		case VK_FORMAT_X8_D24_UNORM_PACK32:
		case VK_FORMAT_D32_SFLOAT:
		default:
			DE_FATAL("Unexpected depth/stencil format");
			return tcu::TextureFormat();
	}
}